

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReduceLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  pointer pcVar5;
  bool bVar6;
  LogMessage *other;
  LayerUnion LVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  string err;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0 [2];
  long local_e0 [2];
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  undefined1 local_c0 [40];
  pointer local_98;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  Result::Result((Result *)&local_98);
  validateInputCount((Result *)local_d0,layer,1,1);
  local_98 = (pointer)local_d0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_c8);
  pcVar5 = local_c0 + 8;
  if (local_c8._M_p != pcVar5) {
    operator_delete(local_c8._M_p,local_c0._8_8_ + 1);
  }
  bVar6 = Result::good((Result *)&local_98);
  if (bVar6) {
    validateOutputCount((Result *)local_d0,layer,1,1);
    local_98 = (pointer)local_d0;
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_c8);
    if (local_c8._M_p != pcVar5) {
      operator_delete(local_c8._M_p,local_c0._8_8_ + 1);
    }
  }
  if ((this->ndArrayInterpretation != true) ||
     ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) goto LAB_0052a4b2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Reduce","");
  validateInputOutputRankEquality((Result *)local_d0,layer,&local_50,&this->blobNameToRank);
  local_98 = (pointer)local_d0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_c8);
  if (local_c8._M_p != pcVar5) {
    operator_delete(local_c8._M_p,local_c0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar6 = Result::good((Result *)&local_98);
  if (!bVar6) goto LAB_0052a4b2;
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    other = google::protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_d0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_d0);
  }
  iVar2 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24
                  );
  local_c8._M_p = (pointer)0x0;
  local_c0[0] = '\0';
  local_d0 = (undefined1  [8])local_c0;
  if (layer->_oneof_case_[0] == 0x118) {
    LVar7 = layer->layer_;
  }
  else {
    LVar7.reduce_ = Specification::ReduceLayerParams::default_instance();
  }
  iVar3 = *(int *)&((LVar7.convolution_)->kernelsize_).rep_;
  switch(iVar3) {
  case 0:
    if (iVar2 < 3) {
LAB_0052a42e:
      psVar4 = (layer->name_).ptr_;
      local_f0[0] = local_e0;
      pcVar5 = (psVar4->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f0,pcVar5,pcVar5 + psVar4->_M_string_length);
      puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x614b2e);
      local_110 = &local_100;
      plVar8 = puVar9 + 2;
      if ((long *)*puVar9 == plVar8) {
        local_100 = *plVar8;
        lStack_f8 = puVar9[3];
      }
      else {
        local_100 = *plVar8;
        local_110 = (long *)*puVar9;
      }
      local_108 = puVar9[1];
      *puVar9 = plVar8;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
LAB_0052a56d:
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_60 = *plVar10;
        lStack_58 = plVar8[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar10;
        local_70 = (long *)*plVar8;
      }
      local_68 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_d0,(string *)&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0],local_e0[0] + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d0);
      if (local_d0 != (undefined1  [8])local_c0) {
        operator_delete((void *)local_d0,CONCAT71(local_c0._1_7_,local_c0[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p != &local_80) {
        operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
    break;
  case 1:
    if (iVar2 < 2) goto LAB_0052a42e;
    break;
  case 2:
  case 3:
  case 4:
    if (iVar2 < 1) goto LAB_0052a42e;
    break;
  default:
    if (iVar3 == 0x7fffffff) {
      psVar4 = (layer->name_).ptr_;
      local_f0[0] = local_e0;
      pcVar5 = (psVar4->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f0,pcVar5,pcVar5 + psVar4->_M_string_length,-iVar3);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x614af7);
      local_110 = &local_100;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_100 = *plVar10;
        lStack_f8 = plVar8[3];
      }
      else {
        local_100 = *plVar10;
        local_110 = (long *)*plVar8;
      }
      local_108 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
      goto LAB_0052a56d;
    }
  }
  if (local_d0 != (undefined1  [8])local_c0) {
    operator_delete((void *)local_d0,CONCAT71(local_c0._1_7_,local_c0[0]) + 1);
  }
LAB_0052a4b2:
  *(pointer *)__return_storage_ptr__ = local_98;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p == &local_80) {
    paVar1->_M_allocated_capacity = local_80._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_80._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_90._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         local_80._M_allocated_capacity;
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_88;
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReduceLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (ndArrayInterpretation && layer.inputtensor_size() > 0) {
        r = validateInputOutputRankEquality(layer, "Reduce", blobNameToRank);
        if (!r.good()) {return r;}
        int rank = static_cast<int>(layer.inputtensor(0).rank());
        bool sufficientInputRank = true;
        std::string err;

        switch (layer.reduce().axis()) {
            case Specification::ReduceLayerParams::CHW:
                if (rank < 3) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::HW:
                if (rank < 2) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::H:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::W:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::C:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MIN_SENTINEL_DO_NOT_USE_:
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MAX_SENTINEL_DO_NOT_USE_:
                err = "Reduce layer: '" + std::string(layer.name()) + "': unknown value for parameter 'axis'.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!sufficientInputRank) {
            err = "Reduce layer '" + std::string(layer.name()) + "': input's rank is smaller than the dimensions provided in the axis parameter";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}